

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

bool_t zmFromMont(word *b,octet *a,qr_o *r,void *stack)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = r->n;
  u64From((u64 *)((long)stack + sVar1 * 8),a,r->no);
  iVar2 = wwCmp((word *)((long)stack + r->n * 8),r->mod,r->n);
  if (iVar2 < 0) {
    wwSetZero((word *)stack,r->n);
    zzMod(b,(word *)stack,r->n * 2,r->mod,r->n,(void *)(sVar1 * 0x10 + (long)stack));
  }
  return (uint)(iVar2 < 0);
}

Assistant:

static bool_t zmFromMont(word b[], const octet a[], const qr_o* r,
	void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	stack = c + 2 * r->n;
	// a \in r?, c <- a * R
	wwFrom(c + r->n, a, r->no);
	if (!zmIsIn(c + r->n, r))
		return FALSE;
	wwSetZero(c, r->n);
	// b <- c \mod mod
	zzMod(b, c, 2 * r->n, r->mod, r->n, stack);
	return TRUE;
}